

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

bool __thiscall cmStdIoConnection::OnServeStart(cmStdIoConnection *this,string *pString)

{
  long lVar1;
  bool bVar2;
  uv_handle_type uVar3;
  uv_stream_s *puVar4;
  uv_prepare_t *handle;
  uv_loop_t *loop;
  uv_prepare_t *prepare;
  allocator<char> local_441;
  string local_440 [32];
  ssize_t local_420;
  ssize_t len;
  char buffer [1024];
  string *pString_local;
  cmStdIoConnection *this_local;
  
  buffer._1016_8_ = pString;
  (*((this->super_cmEventBasedConnection).super_cmConnection.Server)->_vptr_cmServerBase[4])();
  puVar4 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                     (&(this->ReadStream).super_uv_handle_ptr_base_<uv_stream_s>);
  if (puVar4 == (uv_stream_s *)0x0) {
    uVar3 = uv_guess_handle(0);
    if (uVar3 == UV_FILE) {
      while (local_420 = read(0,&len,0x400), local_420 != 0) {
        lVar1 = local_420 + -8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char*,void>(local_440,(char *)&len,buffer + lVar1,&local_441);
        (*(this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection[9])
                  (this,local_440);
        std::__cxx11::string::~string(local_440);
        std::allocator<char>::~allocator(&local_441);
      }
      handle = (uv_prepare_t *)operator_new(0x78);
      memset(handle,0,0x78);
      handle->data = this;
      loop = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
      uv_prepare_init(loop,handle);
      uv_prepare_start(handle,shutdown_connection);
    }
  }
  else {
    puVar4 = ::cm::uv_handle_ptr_::operator_cast_to_uv_stream_s_
                       ((uv_handle_ptr_ *)&this->ReadStream);
    uv_read_start(puVar4,cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
  }
  bVar2 = cmConnection::OnServeStart((cmConnection *)this,(string *)buffer._1016_8_);
  return bVar2;
}

Assistant:

bool cmStdIoConnection::OnServeStart(std::string* pString)
{
  Server->OnConnected(this);
  if (this->ReadStream.get()) {
    uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  } else if (uv_guess_handle(0) == UV_FILE) {
    char buffer[1024];
    while (auto len = read(0, buffer, sizeof(buffer))) {
      ReadData(std::string(buffer, buffer + len));
    }

    // We can't start the disconnect from here, add a prepare hook to do that
    // for us
    auto prepare = new uv_prepare_t();
    prepare->data = this;
    uv_prepare_init(Server->GetLoop(), prepare);
    uv_prepare_start(prepare, shutdown_connection);
  }
  return cmConnection::OnServeStart(pString);
}